

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDTree.hpp
# Opt level: O0

bool __thiscall
kdtree::
KDTree<int,_5U,_kdtree::default_new<int,_5>,_kdtree::default_delete<int>,_kdtree::default_set<int>,_kdtree::default_less<int>_>
::regionIntersects(KDTree<int,_5U,_kdtree::default_new<int,_5>,_kdtree::default_delete<int>,_kdtree::default_set<int>,_kdtree::default_less<int>_>
                   *this,int *searchMin,int *searchMax,int *regionMin,int *regionMax)

{
  bool bVar1;
  bool local_3f;
  default_less<int> local_3e;
  default_less<int> local_3d;
  uint local_3c;
  int *piStack_38;
  int d;
  int *regionMax_local;
  int *regionMin_local;
  int *searchMax_local;
  int *searchMin_local;
  KDTree<int,_5U,_kdtree::default_new<int,_5>,_kdtree::default_delete<int>,_kdtree::default_set<int>,_kdtree::default_less<int>_>
  *this_local;
  
  local_3c = 0;
  piStack_38 = regionMax;
  regionMax_local = regionMin;
  regionMin_local = searchMax;
  searchMax_local = searchMin;
  searchMin_local = (int *)this;
  while( true ) {
    if (4 < local_3c) {
      return true;
    }
    bVar1 = default_less<int>::operator()(&local_3d,piStack_38,searchMax_local,local_3c);
    local_3f = true;
    if (!bVar1) {
      local_3f = default_less<int>::operator()(&local_3e,regionMin_local,regionMax_local,local_3c);
    }
    if (local_3f != false) break;
    local_3c = local_3c + 1;
  }
  return false;
}

Assistant:

bool regionIntersects(const T * const searchMin, const T * const searchMax, const T * const regionMin, const T * const regionMax) const {
			for (int d = 0; d < dim; d++) {
				if (LESS()(regionMax, searchMin, d)
					|| LESS()(searchMax, regionMin, d)) {
					return false;
				}
			}
			return true;
		}